

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O3

QRect __thiscall QFbCursor::drawCursor(QFbCursor *this,QPainter *painter)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  int iVar9;
  undefined1 auVar8 [16];
  QRect QVar10;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  long local_28;
  
  auVar1._8_8_ = local_68._8_8_;
  auVar1._0_8_ = local_68._0_8_;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0xffffffffffffffff;
  if (this[0x10] == (QFbCursor)0x1) {
    this[0x40] = (QFbCursor)0x0;
    auVar8._0_4_ = -(uint)((int)*(undefined8 *)(this + 0x28) ==
                          (int)*(undefined8 *)(this + 0x20) + -1);
    iVar9 = -(uint)((int)((ulong)*(undefined8 *)(this + 0x28) >> 0x20) ==
                   (int)((ulong)*(undefined8 *)(this + 0x20) >> 0x20) + -1);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = iVar9;
    auVar8._12_4_ = iVar9;
    iVar9 = movmskpd((int)local_28,auVar8);
    local_68 = auVar1;
    if (iVar9 != 3) {
      uVar4 = (**(code **)(**(long **)(this + 0x18) + 0x68))();
      iVar9 = (int)((ulong)uVar4 >> 0x20);
      local_48._0_8_ = CONCAT44(*(int *)(this + 0x24) + iVar9,*(int *)(this + 0x20) + (int)uVar4);
      local_48._8_8_ = CONCAT44(iVar9 + *(int *)(this + 0x2c),*(int *)(this + 0x28) + (int)uVar4);
      local_68 = (**(code **)(**(long **)(this + 0x18) + 0x68))();
      cVar2 = QRect::intersects((QRect *)local_48);
      if (cVar2 != '\0') {
        *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x20);
        *(undefined8 *)(this + 0x38) = *(undefined8 *)(this + 0x28);
        uVar7 = *(undefined8 *)(this + 0x48);
        iVar9 = (int)*(undefined8 *)(this + 0x30);
        local_48._0_8_ = (undefined8)iVar9;
        iVar3 = (int)((ulong)*(undefined8 *)(this + 0x30) >> 0x20);
        local_48._8_8_ = (undefined8)iVar3;
        local_38 = (double)(((long)*(int *)(this + 0x38) - (long)iVar9) + 1);
        local_30 = (double)(((long)*(int *)(this + 0x3c) - (long)iVar3) + 1);
        iVar9 = QImage::width();
        iVar3 = QImage::height();
        local_50 = (double)iVar3;
        local_68._0_8_ = 0;
        local_68._8_8_ = 0;
        local_58 = (double)iVar9;
        QPainter::drawImage(painter,local_48,uVar7,local_68,0);
        this[0x41] = (QFbCursor)0x1;
        uVar7 = *(undefined8 *)(this + 0x38);
        uVar5 = *(ulong *)(this + 0x30) & 0xffffffff00000000;
        uVar6 = *(ulong *)(this + 0x30) & 0xffffffff;
        goto LAB_00112695;
      }
    }
  }
  uVar6 = 0;
  uVar5 = 0;
LAB_00112695:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar10._0_8_ = uVar5 | uVar6;
    QVar10.x2.m_i = (int)uVar7;
    QVar10.y2.m_i = (int)((ulong)uVar7 >> 0x20);
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFbCursor::drawCursor(QPainter & painter)
{
    if (!mVisible)
        return QRect();

    mDirty = false;
    if (mCurrentRect.isNull())
        return QRect();

    // We need this because the cursor might be mDirty due to moving off mScreen
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    // global to local translation
    if (!mCurrentRect.translated(mScreenOffset).intersects(mScreen->geometry()))
        return QRect();

    mPrevRect = mCurrentRect;
    painter.drawImage(mPrevRect, *mCursorImage->image());
    mOnScreen = true;
    return mPrevRect;
}